

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void run_container_offset(run_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  rle16_t *prVar1;
  bool bVar2;
  uint uVar3;
  run_container_t *prVar4;
  run_container_t *prVar5;
  undefined6 in_register_0000000a;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint size;
  long lVar10;
  
  size = c->n_runs;
  lVar10 = -1;
  if (0 < (int)size) {
    uVar3 = 0x10000 - (int)CONCAT62(in_register_0000000a,offset);
    prVar1 = c->runs;
    iVar9 = size - 1;
    uVar8 = 0;
    do {
      uVar7 = iVar9 + uVar8 >> 1;
      if (prVar1[uVar7].value < (ushort)uVar3) {
        uVar8 = uVar7 + 1;
      }
      else {
        if (prVar1[uVar7].value <= (ushort)uVar3) goto LAB_00116858;
        iVar9 = uVar7 - 1;
      }
    } while ((int)uVar8 <= iVar9);
    if ((((uVar8 != 0) &&
         (uVar7 = uVar8 - 1,
         (int)((uVar3 & 0xffff) - (uint)prVar1[uVar7].value) <= (int)(uint)prVar1[uVar7].length)) ||
        (uVar7 = uVar8, (int)uVar8 < (int)size)) && (uVar7 != 0xffffffff)) {
LAB_00116858:
      lVar10 = (long)(int)uVar7;
      bVar2 = prVar1[lVar10].value < uVar3;
      uVar3 = size - uVar7;
      size = bVar2 + uVar7;
      goto LAB_00116880;
    }
  }
  bVar2 = false;
  uVar3 = 0;
LAB_00116880:
  prVar4 = (run_container_t *)0x0;
  if ((loc != (container_t **)0x0) && (size != 0)) {
    prVar4 = run_container_create_given_capacity(size);
    memcpy(prVar4->runs,c->runs,(long)(int)size << 2);
    prVar4->n_runs = size;
    if (0 < (int)size) {
      prVar1 = prVar4->runs;
      uVar6 = 0;
      do {
        prVar1[uVar6].value = prVar1[uVar6].value + offset;
        uVar6 = uVar6 + 1;
      } while (size != uVar6);
    }
    *loc = prVar4;
  }
  prVar5 = (run_container_t *)0x0;
  if ((hic != (container_t **)0x0) && (uVar3 != 0)) {
    prVar5 = run_container_create_given_capacity(uVar3);
    memcpy(prVar5->runs,c->runs + lVar10,(long)(int)uVar3 << 2);
    prVar5->n_runs = uVar3;
    if (0 < (int)uVar3) {
      prVar1 = prVar5->runs;
      uVar6 = 0;
      do {
        prVar1[uVar6].value = prVar1[uVar6].value + offset;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    *hic = prVar5;
  }
  if (bVar2) {
    if (prVar4 != (run_container_t *)0x0) {
      prVar4->runs[(long)prVar4->n_runs + -1].length =
           ~prVar4->runs[(long)prVar4->n_runs + -1].value;
    }
    if (prVar5 != (run_container_t *)0x0) {
      prVar1 = prVar5->runs;
      prVar1->length = prVar1->length + prVar1->value;
      prVar1->value = 0;
    }
  }
  return;
}

Assistant:

void run_container_offset(const run_container_t *c, container_t **loc,
                          container_t **hic, uint16_t offset) {
    run_container_t *lo = NULL, *hi = NULL;

    bool split;
    int lo_cap, hi_cap;
    int top, pivot;

    top = (1 << 16) - offset;
    pivot = run_container_index_equalorlarger(c, top);

    if (pivot == -1) {
        split = false;
        lo_cap = c->n_runs;
        hi_cap = 0;
    } else {
        split = c->runs[pivot].value < top;
        lo_cap = pivot + (split ? 1 : 0);
        hi_cap = c->n_runs - pivot;
    }

    if (loc && lo_cap) {
        lo = run_container_create_given_capacity(lo_cap);
        memcpy(lo->runs, c->runs, lo_cap * sizeof(rle16_t));
        lo->n_runs = lo_cap;
        for (int i = 0; i < lo_cap; ++i) {
            lo->runs[i].value += offset;
        }
        *loc = (container_t *)lo;
    }

    if (hic && hi_cap) {
        hi = run_container_create_given_capacity(hi_cap);
        memcpy(hi->runs, c->runs + pivot, hi_cap * sizeof(rle16_t));
        hi->n_runs = hi_cap;
        for (int i = 0; i < hi_cap; ++i) {
            hi->runs[i].value += offset;
        }
        *hic = (container_t *)hi;
    }

    // Fix the split.
    if (split) {
        if (lo != NULL) {
            // Add the missing run to 'lo', exhausting length.
            lo->runs[lo->n_runs - 1].length =
                (1 << 16) - lo->runs[lo->n_runs - 1].value - 1;
        }

        if (hi != NULL) {
            // Fix the first run in 'hi'.
            hi->runs[0].length -= UINT16_MAX - hi->runs[0].value + 1;
            hi->runs[0].value = 0;
        }
    }
}